

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O2

void __thiscall btMultiBodyDynamicsWorld::clearMultiBodyForces(btMultiBodyDynamicsWorld *this)

{
  uint uVar1;
  btMultiBody *this_00;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int i;
  long lVar5;
  bool bVar6;
  CProfileSample __profile;
  CProfileSample local_19;
  
  CProfileManager::Start_Profile("clearMultiBodyForces");
  for (lVar5 = 0; lVar5 < (this->m_multiBodies).m_size; lVar5 = lVar5 + 1) {
    this_00 = (this->m_multiBodies).m_data[lVar5];
    if (this_00->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
      bVar6 = false;
    }
    else {
      bVar6 = *(int *)(this_00->m_baseCollider + 0xec) == 2;
    }
    uVar1 = (this_00->m_links).m_size;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = 0;
    }
    for (lVar4 = 0; uVar3 * 600 - lVar4 != 0; lVar4 = lVar4 + 600) {
      lVar2 = *(long *)((long)((this_00->m_links).m_data)->m_jointTorque + lVar4 + 0x1c);
      if (lVar2 != 0) {
        bVar6 = (bool)(bVar6 | *(int *)(lVar2 + 0xec) == 2);
      }
    }
    if (!bVar6) {
      btMultiBody::clearForcesAndTorques(this_00);
    }
  }
  CProfileSample::~CProfileSample(&local_19);
  return;
}

Assistant:

void btMultiBodyDynamicsWorld::clearMultiBodyForces()
{
              {
                BT_PROFILE("clearMultiBodyForces");
                for (int i=0;i<this->m_multiBodies.size();i++)
                {
                        btMultiBody* bod = m_multiBodies[i];

                        bool isSleeping = false;

                        if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
                        {       
                                isSleeping = true;
                        }
                        for (int b=0;b<bod->getNumLinks();b++)
                        {       
                                if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)     
                                        isSleeping = true;
                        }

                        if (!isSleeping)
                        {
                        btMultiBody* bod = m_multiBodies[i];
                        bod->clearForcesAndTorques();
                	}
		}
	}

}